

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
          (SmallVectorImpl<llvm::StringRef> *this,char **Args)

{
  void *pvVar1;
  char *__s;
  size_t sVar2;
  size_t sVar3;
  undefined8 *puVar4;
  size_t local_60;
  char **Args_local;
  SmallVectorImpl<llvm::StringRef> *this_local;
  
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar3 <= sVar2) {
    SmallVectorTemplateBase<llvm::StringRef,_true>::grow
              (&this->super_SmallVectorTemplateBase<llvm::StringRef,_true>,0);
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  puVar4 = (undefined8 *)((long)pvVar1 + sVar2 * 0x10);
  __s = *Args;
  *puVar4 = __s;
  if (__s == (char *)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = strlen(__s);
  }
  puVar4[1] = local_60;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar2 + 1);
  return;
}

Assistant:

void emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
  }